

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

void __thiscall
tinyusdz::crate::CrateReader::CrateReader
          (CrateReader *this,StreamReader *sr,CrateReaderConfig *config)

{
  _Rb_tree_header *p_Var1;
  CrateReaderConfig *this_00;
  vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_> *pvVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  string sStack_1c8;
  ostringstream ss_w;
  
  this->_version[0] = '\0';
  this->_version[1] = '\0';
  this->_version[2] = '\0';
  pvVar2 = &(this->_toc).sections;
  (pvVar2->super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->_toc).sections.
    super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined4 *)&this->_tokens_index = 0xffffffff;
  *(undefined4 *)((long)&this->_tokens_index + 4) = 0xffffffff;
  *(undefined4 *)&this->_paths_index = 0xffffffff;
  *(undefined4 *)((long)&this->_paths_index + 4) = 0xffffffff;
  *(undefined4 *)&this->_strings_index = 0xffffffff;
  *(undefined4 *)((long)&this->_strings_index + 4) = 0xffffffff;
  *(undefined4 *)&this->_fields_index = 0xffffffff;
  *(undefined4 *)((long)&this->_fields_index + 4) = 0xffffffff;
  *(undefined4 *)&this->_fieldsets_index = 0xffffffff;
  *(undefined4 *)((long)&this->_fieldsets_index + 4) = 0xffffffff;
  *(undefined4 *)&this->_specs_index = 0xffffffff;
  *(undefined4 *)((long)&this->_specs_index + 4) = 0xffffffff;
  (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header;
  (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&this->_tokens,0,0xc0);
  (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_sr = sr;
  (this->_err)._M_dataplus._M_p = (pointer)&(this->_err).field_2;
  (this->_err)._M_string_length = 0;
  (this->_err).field_2._M_local_buf[0] = '\0';
  (this->_warn)._M_dataplus._M_p = (pointer)&(this->_warn).field_2;
  (this->_warn)._M_string_length = 0;
  (this->_warn).field_2._M_local_buf[0] = '\0';
  (this->unpackRecursionGuard)._M_h._M_buckets = &(this->unpackRecursionGuard)._M_h._M_single_bucket
  ;
  (this->unpackRecursionGuard)._M_h._M_bucket_count = 1;
  (this->unpackRecursionGuard)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (this->unpackRecursionGuard)._M_h._M_element_count = 0;
  (this->unpackRecursionGuard)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(this->unpackRecursionGuard)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  this_00 = &this->_config;
  CrateReaderConfig::CrateReaderConfig(this_00);
  this->_memoryUsage = 0;
  this->_impl = (Impl *)0x0;
  memcpy(this_00,config,0x98);
  iVar4 = (this->_config).numThreads;
  if (iVar4 == -1) {
    iVar3 = ::std::thread::hardware_concurrency();
    iVar4 = 1;
    if (1 < iVar3) {
      iVar4 = iVar3;
    }
    this_00->numThreads = iVar4;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_w);
    poVar5 = ::std::operator<<((ostream *)&ss_w,"[warn]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"CrateReader");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x5c);
    ::std::operator<<(poVar5," ");
    poVar5 = ::std::operator<<((ostream *)&ss_w,"# of thread to use: ");
    ::std::__cxx11::to_string(&sStack_1c8,this_00->numThreads);
    poVar5 = ::std::operator<<(poVar5,(string *)&sStack_1c8);
    ::std::operator<<(poVar5,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_warn);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_w);
    iVar4 = this_00->numThreads;
  }
  iVar3 = 0x400;
  if (iVar4 < 0x400) {
    iVar3 = iVar4;
  }
  this_00->numThreads = iVar3;
  return;
}

Assistant:

CrateReader::CrateReader(StreamReader *sr, const CrateReaderConfig &config) : _sr(sr), _impl(nullptr) {
  _config = config;
  if (_config.numThreads == -1) {
#if defined(__wasi__)
#else
    _config.numThreads = (std::max)(1, int(std::thread::hardware_concurrency()));
    PUSH_WARN("# of thread to use: " << std::to_string(_config.numThreads));
#endif
  }


#if defined(__wasi__)
  PUSH_WARN("Threading is disabled for WASI build.");
  _config.numThreads = 1;
#else

  // Limit to 1024 threads.
  _config.numThreads = (std::min)(1024, _config.numThreads);
#endif

  //_impl = new Impl();

}